

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O1

void record_graphics_pipelines(StateRecorder *recorder)

{
  StateRecorder *this;
  bool bVar1;
  Hash hash [2];
  uint32_t color_locs [3];
  VkGraphicsPipelineCreateInfo pipe;
  VkPipelineCreationFeedbackCreateInfoEXT feedback;
  VkPipelineViewportStateCreateInfo vp;
  VkRenderingAttachmentLocationInfoKHR attachment_location_info;
  VkPipelineViewportDepthClampControlCreateInfoEXT clamp_control;
  VkRenderingInputAttachmentIndexInfoKHR input_attachment_info;
  VkPipelineViewportDepthClipControlCreateInfoEXT clip_control;
  VkPipelineRobustnessCreateInfoEXT robustness_info;
  VkSampleLocationEXT locations [2];
  VkDepthBiasRepresentationInfoEXT depth_bias_representation_info;
  VkPipelineRasterizationProvokingVertexStateCreateInfoEXT provoking_vertex;
  VkPipelineRasterizationStateStreamCreateInfoEXT stream_state;
  VkPipelineRasterizationDepthClipStateCreateInfoEXT clip_state;
  VkPipelineTessellationDomainOriginStateCreateInfo domain;
  VkPipelineTessellationStateCreateInfo tess;
  VkPipelineMultisampleStateCreateInfo ms;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT required_size;
  VkPipelineFragmentShadingRateStateCreateInfoKHR fragment_shading_rate;
  VkPipelineColorWriteCreateInfoEXT color_write;
  VkPipelineRasterizationLineStateCreateInfoEXT line_state;
  VkPipelineRasterizationConservativeStateCreateInfoEXT conservative_state;
  VkPipelineColorBlendAdvancedStateCreateInfoEXT advanced;
  VkPipelineVertexInputDivisorStateCreateInfoEXT divisor2;
  VkPipelineVertexInputDivisorStateCreateInfoEXT divisor;
  VkPipelineInputAssemblyStateCreateInfo ia;
  VkPipelineRasterizationStateCreateInfo rs;
  VkPipelineDynamicStateCreateInfo dyn;
  VkSpecializationInfo spec;
  VkPipelineDiscardRectangleStateCreateInfoEXT discard_rectangle;
  VkPipelineVertexInputStateCreateInfo vi;
  VkPipelineColorBlendStateCreateInfo blend;
  VkPipelineShaderStageCreateInfo stages [2];
  VkPipelineDepthStencilStateCreateInfo ds;
  Hash local_678;
  Hash local_670 [2];
  StateRecorder *local_660;
  undefined8 local_658;
  undefined4 local_650 [2];
  undefined8 local_648;
  undefined4 local_63c;
  VkGraphicsPipelineCreateInfo local_638;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  VkPipelineViewportStateCreateInfo local_578;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 *puStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 *puStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 *puStack_4f0;
  long local_4e8;
  undefined4 *puStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 *puStack_420;
  undefined8 local_418;
  undefined8 local_408;
  undefined8 *puStack_400;
  undefined8 local_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  VkPipelineTessellationStateCreateInfo local_3c8;
  VkPipelineMultisampleStateCreateInfo local_3a8;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 *puStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined4 *puStack_2e0;
  undefined8 local_2d8;
  undefined8 *puStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 *puStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 *puStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined4 *puStack_260;
  undefined8 local_258;
  undefined8 *puStack_250;
  undefined8 local_248;
  undefined4 *puStack_240;
  VkPipelineInputAssemblyStateCreateInfo local_238;
  VkPipelineRasterizationStateCreateInfo local_218;
  VkPipelineDynamicStateCreateInfo local_1d8;
  VkSpecializationInfo local_1b8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_178;
  VkPipelineVertexInputStateCreateInfo local_168;
  VkPipelineColorBlendStateCreateInfo local_138;
  VkPipelineShaderStageCreateInfo local_f8;
  undefined8 local_c8;
  undefined8 *puStack_c0;
  undefined8 local_b8;
  undefined1 *puStack_b0;
  char *local_a8;
  VkSpecializationInfo *pVStack_a0;
  VkPipelineDepthStencilStateCreateInfo local_98;
  
  local_1b8.dataSize = 0x10;
  local_1b8.pData = record_graphics_pipelines::data;
  local_1b8.mapEntryCount = 2;
  local_1b8._4_4_ = 0;
  local_1b8.pMapEntries = record_graphics_pipelines::entries;
  local_660 = recorder;
  memset(&local_638,0,0x90);
  this = local_660;
  local_638.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_638.layout = (VkPipelineLayout)&DAT_00002712;
  local_638.subpass = 1;
  local_638.renderPass = (VkRenderPass)&DAT_00007531;
  local_638.stageCount = 2;
  local_638.pStages = &local_f8;
  local_f8.pNext = (void *)0x0;
  local_f8.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_f8._4_4_ = 0;
  local_f8.flags = 0;
  local_f8.stage = VK_SHADER_STAGE_VERTEX_BIT;
  local_f8.pName = "vert";
  local_f8.module = (VkShaderModule)&DAT_00001388;
  local_c8 = 0x12;
  local_b8 = 0x1000000000;
  local_a8 = "frag";
  puStack_b0 = &DAT_00001389;
  puStack_c0 = &local_378;
  local_378 = 0x3b9e38e9;
  uStack_370 = 0;
  local_368 = 0x10;
  local_638.pVertexInputState = &local_168;
  local_168.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_168._4_4_ = 0;
  local_638.pMultisampleState = &local_3a8;
  local_3a8.pNext = (undefined8 *)0x0;
  local_3a8.flags = 0;
  local_3a8.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_3a8._4_4_ = 0;
  local_638.pDynamicState = &local_1d8;
  local_1d8.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_1d8._4_4_ = 0;
  local_1d8.pNext = (void *)0x0;
  local_638.pViewportState = &local_578;
  local_578.pNext = (undefined8 *)0x0;
  local_578.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_578._4_4_ = 0;
  local_638.pColorBlendState = &local_138;
  local_138.flags = 0;
  local_138.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_138._4_4_ = 0;
  local_638.pTessellationState = &local_3c8;
  local_3c8.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_3c8._4_4_ = 0;
  local_168.pNext = &local_258;
  local_258 = 0x3b9db031;
  puStack_250 = &local_278;
  local_278 = 0x3b9db031;
  uStack_270 = 0;
  local_248 = 2;
  local_268 = 1;
  puStack_260 = &local_478;
  local_478 = 0;
  uStack_474 = 1;
  uStack_470 = 1;
  uStack_46c = 4;
  local_138.pNext = &local_298;
  local_168.flags = 0;
  local_168.vertexBindingDescriptionCount = 2;
  local_168.vertexAttributeDescriptionCount = 2;
  local_168._36_4_ = 0;
  local_168.pVertexBindingDescriptions = record_graphics_pipelines::binds;
  local_168.pVertexAttributeDescriptions = record_graphics_pipelines::attrs;
  local_3a8.rasterizationSamples = VK_SAMPLE_COUNT_16_BIT;
  local_3a8.sampleShadingEnable = 1;
  local_3a8.minSampleShading = 0.5;
  local_3a8.alphaToCoverageEnable = 1;
  local_3a8.alphaToOneEnable = 1;
  local_3a8.pSampleMask = &record_graphics_pipelines::mask;
  local_1d8.flags = 0;
  local_1d8.dynamicStateCount = 3;
  local_1d8.pDynamicStates = record_graphics_pipelines::dyn_states;
  local_578.flags = 0;
  local_578.viewportCount = 2;
  local_578.scissorCount = 2;
  local_578._36_4_ = 0;
  local_578.pViewports = record_graphics_pipelines::vps;
  local_578.pScissors = record_graphics_pipelines::sci;
  local_138.logicOpEnable = 1;
  local_138.logicOp = VK_LOGIC_OP_AND_INVERTED;
  local_138.blendConstants[0] = 9.0;
  local_138.blendConstants[1] = 19.0;
  local_138.blendConstants[2] = 29.0;
  local_138.blendConstants[3] = 39.0;
  local_138.attachmentCount = 2;
  local_138.pAttachments = record_graphics_pipelines::blend_attachments;
  local_3c8.pNext = &local_3e8;
  local_638.pDepthStencilState = &local_98;
  local_98.pNext = (void *)0x0;
  local_98.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_98._4_4_ = 0;
  local_3c8.flags = 0;
  local_3c8.patchControlPoints = 9;
  local_3e8 = 0x3b9c930b;
  uStack_3e0 = 0;
  local_3d8 = 1;
  local_638.pRasterizationState = &local_218;
  local_218.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_218._4_4_ = 0;
  local_298 = 0x3b9d0c22;
  uStack_280 = 2;
  local_98.front.writeMask = 9;
  local_98.front.reference = 10;
  local_98.front.depthFailOp = VK_STENCIL_OP_INVERT;
  local_98.front.compareOp = VK_COMPARE_OP_GREATER;
  local_98.front.compareMask = 0x13;
  local_98.front.failOp = VK_STENCIL_OP_INCREMENT_AND_CLAMP;
  local_98.front.passOp = VK_STENCIL_OP_REPLACE;
  local_98.back.writeMask = 0x4f;
  local_98.back.reference = 0x50;
  local_98.back.failOp = VK_STENCIL_OP_INCREMENT_AND_WRAP;
  local_98.back.compareOp = VK_COMPARE_OP_LESS;
  local_98.back.compareMask = 0x1d;
  local_98.back.passOp = VK_STENCIL_OP_INCREMENT_AND_CLAMP;
  local_98.back.depthFailOp = VK_STENCIL_OP_ZERO;
  local_98.minDepthBounds = 0.1;
  local_98.maxDepthBounds = 0.2;
  local_218.flags = 0;
  local_218.depthClampEnable = 1;
  local_218.depthBiasEnable = 1;
  local_218.depthBiasSlopeFactor = 0.3;
  local_218.depthBiasConstantFactor = 0.8;
  local_218.depthBiasClamp = 0.5;
  local_218.rasterizerDiscardEnable = 0;
  local_218.polygonMode = VK_POLYGON_MODE_LINE;
  local_218.lineWidth = 0.1;
  local_218._60_4_ = 0;
  local_218.cullMode = 3;
  local_218.frontFace = VK_FRONT_FACE_CLOCKWISE;
  local_218.pNext = &local_408;
  local_408 = 0x3b9c5871;
  local_3f8 = 0x100000000;
  puStack_400 = &local_428;
  local_428 = 0x3b9b3762;
  local_418 = 0x100000000;
  puStack_420 = &local_2b8;
  local_2b8 = 0x3b9c5489;
  puStack_2b0 = &local_2d8;
  local_2d8 = 0x3b9ebdb9;
  local_2c8 = 0x100000002;
  local_2a8 = 0x100000000;
  uStack_2a0 = 0x40200000;
  local_638.pInputAssemblyState = &local_238;
  local_238.flags = 0;
  local_238._28_4_ = 0;
  local_238.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_238._4_4_ = 0;
  local_238.pNext = (void *)0x0;
  local_98.depthWriteEnable = 1;
  local_98.depthCompareOp = VK_COMPARE_OP_EQUAL;
  local_98.flags = 0;
  local_98.depthTestEnable = 1;
  local_98.depthBoundsTestEnable = 1;
  local_98.stencilTestEnable = 1;
  local_238.topology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  local_238.primitiveRestartEnable = 1;
  puStack_290 = &local_2f8;
  local_2f8 = 0x3ba09a49;
  uStack_2f0 = 0;
  puStack_2e0 = &local_63c;
  local_63c = 1;
  local_2e8 = 1;
  local_288 = 0x100000001;
  puStack_2d0 = &local_448;
  uStack_2c0 = 0x300000002;
  local_448 = 0x3b9eaa31;
  uStack_440 = 0;
  local_438 = 0;
  puStack_240 = puStack_260;
  local_f8.pSpecializationInfo = &local_1b8;
  pVStack_a0 = &local_1b8;
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (local_660,(VkPipeline)&DAT_000186a0,&local_638,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (bVar1) {
    local_578._16_8_ = local_578._16_8_ & 0xffffffff;
    local_578.scissorCount = 0;
    local_638.basePipelineHandle = (VkPipeline)&DAT_000186a0;
    local_638.basePipelineIndex = 200;
    bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                      (this,(VkPipeline)&DAT_000186a1,&local_638,(VkPipeline *)0x0,0,0,(VkDevice)0x0
                       ,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
    if (bVar1) {
      uStack_5a0 = 0;
      local_598 = 0;
      uStack_590 = 0;
      local_588 = 0;
      local_5a8 = 0x3b9db800;
      bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline(this,&local_638,&local_678);
      if (bVar1) {
        local_638.pNext = &local_5a8;
        bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline(this,&local_638,local_670);
        if ((bVar1) && (local_678 == local_670[0])) {
          bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                            (this,(VkPipeline)&DAT_000186a2,&local_638,(VkPipeline *)0x0,0,0,
                             (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
          if (bVar1) {
            local_638.pNext = &local_198;
            uStack_190 = 0;
            local_198 = 0x3b9c4cb9;
            local_178 = &local_488;
            local_488 = 0;
            uStack_480 = 0x2000000020;
            local_188 = 0x100000000;
            uStack_180 = 1;
            bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                              (this,(VkPipeline)&DAT_000186a3,&local_638,(VkPipeline *)0x0,0,0,
                               (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
            if (bVar1) {
              local_638.pNext = &local_318;
              local_318 = 0x3b9e3cd1;
              uStack_310 = 0;
              local_308 = 0x200000002;
              uStack_300 = 1;
              bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                (this,(VkPipeline)&DAT_000186a4,&local_638,(VkPipeline *)0x0,0,0,
                                 (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
              if (bVar1) {
                local_3a8.pNext = &local_358;
                uStack_350 = 0;
                local_348 = 0;
                local_338 = 0;
                local_358 = 0x3b9cf89a;
                uStack_340 = 0x3b9cf898;
                local_328 = 0x200000003;
                uStack_330 = 0x200000002;
                puStack_320 = &local_498;
                local_498 = 0x3f0000003e000000;
                uStack_490 = 0x3e800000be800000;
                local_638.basePipelineHandle = (VkPipeline)0x0;
                bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                  (this,(VkPipeline)&DAT_000186a5,&local_638,(VkPipeline *)0x0,0,0,
                                   (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                if (bVar1) {
                  local_348 = CONCAT44(local_348._4_4_,1);
                  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                    (this,(VkPipeline)&DAT_000186a6,&local_638,(VkPipeline *)0x0,0,0
                                     ,(VkDevice)0x0,
                                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                  if (bVar1) {
                    local_578.pNext = &local_4d8;
                    local_4d8 = 0x3ba034b9;
                    uStack_4d0 = 0;
                    local_4c8 = 0;
                    bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                      (this,(VkPipeline)&DAT_000186a7,&local_638,(VkPipeline *)0x0,0
                                       ,0,(VkDevice)0x0,
                                       (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                    if (bVar1) {
                      local_4c8 = CONCAT44(local_4c8._4_4_,1);
                      bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                        (this,(VkPipeline)&DAT_000186a8,&local_638,(VkPipeline *)0x0
                                         ,0,0,(VkDevice)0x0,
                                         (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                      if (bVar1) {
                        local_638.pNext = &local_4b8;
                        local_4b8 = 0x3b9bd3a0;
                        uStack_4b0 = 0;
                        uStack_4a0 = 0x300000003;
                        local_4a8 = 0x200000001;
                        bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                          (this,(VkPipeline)&DAT_000186a9,&local_638,
                                           (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                           (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                        if (bVar1) {
                          uStack_4a0 = CONCAT44(1,(undefined4)uStack_4a0);
                          bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                            (this,(VkPipeline)&DAT_000186aa,&local_638,
                                             (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                             (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                          if (bVar1) {
                            local_218.pNext = &local_468;
                            local_468 = 0x3b9f1b7a;
                            uStack_460 = 0;
                            local_458 = 0x100000001;
                            bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                              (this,(VkPipeline)&DAT_000186ab,&local_638,
                                               (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                               (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                            if (bVar1) {
                              local_578.pNext = &local_528;
                              puStack_510 = (undefined8 *)0x0;
                              local_528 = 0x3ba3ab71;
                              uStack_520 = 0;
                              local_518 = 0;
                              bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                                (this,(VkPipeline)&DAT_000186ac,&local_638,
                                                 (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                                 (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                              if (bVar1) {
                                local_518 = CONCAT44(local_518._4_4_,1);
                                puStack_510 = &local_648;
                                local_648 = 0x3f4ccccd3f000000;
                                bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                                  (this,(VkPipeline)&DAT_000186ad,&local_638,
                                                   (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                                   (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0
                                                  );
                                if (bVar1) {
                                  local_648 = 0x3e4ccccd3f4ccccd;
                                  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                                    (this,(VkPipeline)&DAT_000186ae,&local_638,
                                                     (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)
                                                     0x0);
                                  if (bVar1) {
                                    local_638.pNext = &local_548;
                                    puStack_530 = (undefined8 *)0x0;
                                    local_548 = 0x3b9e5441;
                                    uStack_540 = 0;
                                    local_538 = 1;
                                    bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                                      (this,(VkPipeline)&DAT_000186af,&local_638,
                                                       (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                                       (PFN_vkGetShaderModuleCreateInfoIdentifierEXT
                                                       )0x0);
                                    if (bVar1) {
                                      local_538 = CONCAT44(local_538._4_4_,2);
                                      bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                                        (this,(VkPipeline)&DAT_000186b0,&local_638,
                                                         (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                                         (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                      if (bVar1) {
                                        local_658 = 0x400000005;
                                        local_650[0] = 0xffffffff;
                                        puStack_530 = &local_658;
                                        bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                                          (this,(VkPipeline)&DAT_000186b1,&local_638
                                                           ,(VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                                           (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                        if (bVar1) {
                                          local_638.pNext = &local_508;
                                          uStack_500 = 0;
                                          puStack_4f0 = (undefined8 *)0x0;
                                          local_4e8 = 0;
                                          puStack_4e0 = (undefined4 *)0x0;
                                          local_508 = 0x3b9e5442;
                                          local_4f8 = 2;
                                          bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                                            (this,(VkPipeline)&DAT_000186b2,
                                                             &local_638,(VkPipeline *)0x0,0,0,
                                                             (VkDevice)0x0,
                                                             (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                          if (bVar1) {
                                            puStack_4f0 = &local_658;
                                            bVar1 = Fossilize::StateRecorder::
                                                    record_graphics_pipeline
                                                              (this,(VkPipeline)&DAT_000186b3,
                                                               &local_638,(VkPipeline *)0x0,0,0,
                                                               (VkDevice)0x0,
                                                               (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                            if (bVar1) {
                                              local_4e8 = (long)&local_658 + 4;
                                              bVar1 = Fossilize::StateRecorder::
                                                      record_graphics_pipeline
                                                                (this,(VkPipeline)&DAT_000186b4,
                                                                 &local_638,(VkPipeline *)0x0,0,0,
                                                                 (VkDevice)0x0,
                                                                 (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                              if (bVar1) {
                                                puStack_4e0 = local_650;
                                                bVar1 = Fossilize::StateRecorder::
                                                        record_graphics_pipeline
                                                                  (this,(VkPipeline)&DAT_000186b5,
                                                                   &local_638,(VkPipeline *)0x0,0,0,
                                                                   (VkDevice)0x0,
                                                                   (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                                if (bVar1) {
                                                  return;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  abort();
}

Assistant:

static void record_graphics_pipelines(StateRecorder &recorder)
{
	VkSpecializationInfo spec = {};
	spec.dataSize = 16;
	static const float data[4] = { 1.0f, 2.0f, 3.0f, 4.0f };
	spec.pData = data;
	spec.mapEntryCount = 2;
	static const VkSpecializationMapEntry entries[2] = {
		{ 0, 4, 8 },
		{ 4, 4, 16 },
	};
	spec.pMapEntries = entries;

	VkGraphicsPipelineCreateInfo pipe = { VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO };
	pipe.layout = fake_handle<VkPipelineLayout>(10002);
	pipe.subpass = 1;
	pipe.renderPass = fake_handle<VkRenderPass>(30001);
	pipe.stageCount = 2;

	VkPipelineShaderStageCreateInfo stages[2] = {};
	stages[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	stages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
	stages[0].pName = "vert";
	stages[0].module = fake_handle<VkShaderModule>(5000);
	stages[0].pSpecializationInfo = &spec;
	stages[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	stages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
	stages[1].pName = "frag";
	stages[1].module = fake_handle<VkShaderModule>(5001);
	stages[1].pSpecializationInfo = &spec;

	VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT required_size =
			{ VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT };
	required_size.requiredSubgroupSize = 16;
	stages[1].pNext = &required_size;

	pipe.pStages = stages;

	VkPipelineVertexInputStateCreateInfo vi = { VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO };
	VkPipelineMultisampleStateCreateInfo ms = { VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO };
	VkPipelineDynamicStateCreateInfo dyn = { VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO };
	VkPipelineViewportStateCreateInfo vp = { VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO };
	VkPipelineColorBlendStateCreateInfo blend = { VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO };
	VkPipelineTessellationStateCreateInfo tess = { VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO };
	VkPipelineDepthStencilStateCreateInfo ds = { VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO };
	VkPipelineRasterizationStateCreateInfo rs = { VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO };
	VkPipelineInputAssemblyStateCreateInfo ia = { VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO };

	VkPipelineVertexInputDivisorStateCreateInfoEXT divisor = { VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_EXT };
	VkPipelineVertexInputDivisorStateCreateInfoEXT divisor2 = { VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_EXT };
	divisor.vertexBindingDivisorCount = 2;
	divisor2.vertexBindingDivisorCount = 1;

	VkVertexInputBindingDivisorDescriptionEXT divisor_descs[2] = {};
	divisor_descs[0].binding = 0;
	divisor_descs[0].divisor = 1;
	divisor_descs[1].binding = 1;
	divisor_descs[1].divisor = 4;
	divisor.pVertexBindingDivisors = divisor_descs;
	divisor2.pVertexBindingDivisors = divisor_descs;
	vi.pNext = &divisor;
	divisor.pNext = &divisor2;

	VkPipelineColorBlendAdvancedStateCreateInfoEXT advanced = { VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT };
	advanced.blendOverlap = VK_BLEND_OVERLAP_CONJOINT_EXT;
	advanced.srcPremultiplied = VK_TRUE;
	advanced.dstPremultiplied = VK_TRUE;
	blend.pNext = &advanced;

	static const VkVertexInputAttributeDescription attrs[2] = {
		{ 2, 1, VK_FORMAT_R16G16_SFLOAT, 5 },
		{ 9, 1, VK_FORMAT_R8_UINT, 5 },
	};
	static const VkVertexInputBindingDescription binds[2] = {
		{ 8, 1, VK_VERTEX_INPUT_RATE_INSTANCE },
		{ 9, 6, VK_VERTEX_INPUT_RATE_VERTEX },
	};
	vi.vertexBindingDescriptionCount = 2;
	vi.vertexAttributeDescriptionCount = 2;
	vi.pVertexBindingDescriptions = binds;
	vi.pVertexAttributeDescriptions = attrs;

	ms.rasterizationSamples = VK_SAMPLE_COUNT_16_BIT;
	ms.sampleShadingEnable = VK_TRUE;
	ms.minSampleShading = 0.5f;
	ms.alphaToCoverageEnable = VK_TRUE;
	ms.alphaToOneEnable = VK_TRUE;
	static const uint32_t mask = 0xf;
	ms.pSampleMask = &mask;

	static const VkDynamicState dyn_states[3] = {
			VK_DYNAMIC_STATE_BLEND_CONSTANTS,
			VK_DYNAMIC_STATE_DEPTH_BIAS,
			VK_DYNAMIC_STATE_LINE_WIDTH
	};
	dyn.dynamicStateCount = 3;
	dyn.pDynamicStates = dyn_states;

	static const VkViewport vps[2] = {
		{ 1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 6.0f },
		{ 11.0f, 12.0f, 13.0f, 14.0f, 15.0f, 16.0f },
	};
	static const VkRect2D sci[2] = {
		{ { 3, 4 }, { 8, 9 }},
		{ { 13, 14 }, { 18, 19 }},
	};
	vp.viewportCount = 2;
	vp.scissorCount = 2;
	vp.pViewports = vps;
	vp.pScissors = sci;

	static const VkPipelineColorBlendAttachmentState blend_attachments[2] = {
			{ VK_TRUE,
					VK_BLEND_FACTOR_DST_ALPHA, VK_BLEND_FACTOR_DST_ALPHA, VK_BLEND_OP_ADD,
					VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA, VK_BLEND_FACTOR_ONE_MINUS_SRC1_ALPHA, VK_BLEND_OP_SUBTRACT,
					0xf },
			{ VK_TRUE,
					VK_BLEND_FACTOR_SRC_ALPHA, VK_BLEND_FACTOR_SRC_ALPHA, VK_BLEND_OP_ADD,
					VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA, VK_BLEND_FACTOR_ONE_MINUS_SRC1_ALPHA, VK_BLEND_OP_SUBTRACT,
					0x3 },
	};
	blend.logicOpEnable = VK_TRUE;
	blend.logicOp = VK_LOGIC_OP_AND_INVERTED;
	blend.blendConstants[0] = 9.0f;
	blend.blendConstants[1] = 19.0f;
	blend.blendConstants[2] = 29.0f;
	blend.blendConstants[3] = 39.0f;
	blend.attachmentCount = 2;
	blend.pAttachments = blend_attachments;

	tess.patchControlPoints = 9;
	VkPipelineTessellationDomainOriginStateCreateInfo domain =
			{ VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO };
	domain.domainOrigin = VK_TESSELLATION_DOMAIN_ORIGIN_LOWER_LEFT;
	tess.pNext = &domain;

	ds.front.compareOp = VK_COMPARE_OP_GREATER;
	ds.front.writeMask = 9;
	ds.front.reference = 10;
	ds.front.failOp = VK_STENCIL_OP_INCREMENT_AND_CLAMP;
	ds.front.depthFailOp = VK_STENCIL_OP_INVERT;
	ds.front.compareMask = 19;
	ds.front.passOp = VK_STENCIL_OP_REPLACE;
	ds.back.compareOp = VK_COMPARE_OP_LESS;
	ds.back.writeMask = 79;
	ds.back.reference = 80;
	ds.back.failOp = VK_STENCIL_OP_INCREMENT_AND_WRAP;
	ds.back.depthFailOp = VK_STENCIL_OP_ZERO;
	ds.back.compareMask = 29;
	ds.back.passOp = VK_STENCIL_OP_INCREMENT_AND_CLAMP;
	ds.stencilTestEnable = VK_TRUE;
	ds.minDepthBounds = 0.1f;
	ds.maxDepthBounds = 0.2f;
	ds.depthCompareOp = VK_COMPARE_OP_EQUAL;
	ds.depthWriteEnable = VK_TRUE;
	ds.depthTestEnable = VK_TRUE;
	ds.depthBoundsTestEnable = VK_TRUE;

	rs.frontFace = VK_FRONT_FACE_CLOCKWISE;
	rs.polygonMode = VK_POLYGON_MODE_LINE;
	rs.depthClampEnable = VK_TRUE;
	rs.depthBiasEnable = VK_TRUE;
	rs.depthBiasSlopeFactor = 0.3f;
	rs.depthBiasConstantFactor = 0.8f;
	rs.depthBiasClamp = 0.5f;
	rs.rasterizerDiscardEnable = VK_FALSE;
	rs.lineWidth = 0.1f;
	rs.cullMode = VK_CULL_MODE_FRONT_AND_BACK;

	VkPipelineRasterizationDepthClipStateCreateInfoEXT clip_state =
			{ VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT };
	clip_state.depthClipEnable = VK_TRUE;
	rs.pNext = &clip_state;

	VkPipelineRasterizationStateStreamCreateInfoEXT stream_state =
			{ VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT };
	stream_state.rasterizationStream = VK_TRUE;
	clip_state.pNext = &stream_state;

	VkPipelineRasterizationConservativeStateCreateInfoEXT conservative_state =
			{ VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT };
	conservative_state.flags = 0;
	conservative_state.extraPrimitiveOverestimationSize = 2.5f;
	conservative_state.conservativeRasterizationMode = VK_CONSERVATIVE_RASTERIZATION_MODE_OVERESTIMATE_EXT;
	stream_state.pNext = &conservative_state;

	VkPipelineRasterizationLineStateCreateInfoEXT line_state =
			{ VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_EXT };
	line_state.lineRasterizationMode = VK_LINE_RASTERIZATION_MODE_BRESENHAM_EXT;
	line_state.lineStippleFactor = 2;
	line_state.lineStipplePattern = 3;
	line_state.stippledLineEnable = VK_TRUE;
	conservative_state.pNext = &line_state;

	ia.topology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
	ia.primitiveRestartEnable = VK_TRUE;

	VkPipelineColorWriteCreateInfoEXT color_write =
			{ VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT };
	VkBool32 color_write_enables[1] = { };
	color_write_enables[0] = VK_TRUE;
	color_write.attachmentCount = 1;
	color_write.pColorWriteEnables = color_write_enables;
	advanced.pNext = &color_write;

	VkPipelineRasterizationProvokingVertexStateCreateInfoEXT provoking_vertex =
			{ VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT };
	provoking_vertex.provokingVertexMode = VK_PROVOKING_VERTEX_MODE_FIRST_VERTEX_EXT;
	line_state.pNext = &provoking_vertex;

	pipe.pVertexInputState = &vi;
	pipe.pMultisampleState = &ms;
	pipe.pDynamicState = &dyn;
	pipe.pViewportState = &vp;
	pipe.pColorBlendState = &blend;
	pipe.pTessellationState = &tess;
	pipe.pDepthStencilState = &ds;
	pipe.pRasterizationState = &rs;
	pipe.pInputAssemblyState = &ia;

	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100000), pipe, nullptr, 0))
		abort();

	vp.viewportCount = 0;
	vp.scissorCount = 0;
	pipe.basePipelineHandle = fake_handle<VkPipeline>(100000);
	pipe.basePipelineIndex = 200;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100001), pipe, nullptr, 0))
		abort();

	VkPipelineCreationFeedbackCreateInfoEXT feedback = { VK_STRUCTURE_TYPE_PIPELINE_CREATION_FEEDBACK_CREATE_INFO_EXT };

	Hash hash[2];
	if (!Hashing::compute_hash_graphics_pipeline(recorder, pipe, &hash[0]))
		abort();
	pipe.pNext = &feedback;
	if (!Hashing::compute_hash_graphics_pipeline(recorder, pipe, &hash[1]))
		abort();

	if (hash[0] != hash[1])
		abort();

	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100002), pipe, nullptr, 0))
		abort();

	VkPipelineDiscardRectangleStateCreateInfoEXT discard_rectangle =
			{ VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT };
	VkRect2D discard_rectangles[1] = {};
	discard_rectangles[0].offset.x = 0;
	discard_rectangles[0].offset.y = 0;
	discard_rectangles[0].extent.width = 32;
	discard_rectangles[0].extent.height = 32;
	discard_rectangle.flags = 0;
	discard_rectangle.discardRectangleMode = VK_DISCARD_RECTANGLE_MODE_EXCLUSIVE_EXT;
	discard_rectangle.discardRectangleCount = 1;
	discard_rectangle.pDiscardRectangles = discard_rectangles;
	pipe.pNext = &discard_rectangle;

	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100003), pipe, nullptr, 0))
		abort();

	VkPipelineFragmentShadingRateStateCreateInfoKHR fragment_shading_rate =
			{ VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR };
	fragment_shading_rate.fragmentSize.width = 2;
	fragment_shading_rate.fragmentSize.height = 2;
	fragment_shading_rate.combinerOps[0] = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_REPLACE_KHR;
	fragment_shading_rate.combinerOps[1] = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_KEEP_KHR;
	pipe.pNext = &fragment_shading_rate;

	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100004), pipe, nullptr, 0))
		abort();

	VkPipelineSampleLocationsStateCreateInfoEXT sample_location = { VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT };
	sample_location.sampleLocationsInfo.sType = VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT;
	sample_location.sampleLocationsInfo.sampleLocationGridSize = { 2, 3 };
	sample_location.sampleLocationsInfo.sampleLocationsPerPixel = VK_SAMPLE_COUNT_2_BIT;
	sample_location.sampleLocationsInfo.sampleLocationsCount = 2;
	const VkSampleLocationEXT locations[2] = {{ 0.125f, 0.5f }, { -0.25f, 0.25f }};
	sample_location.sampleLocationsInfo.pSampleLocations = locations;
	ms.pNext = &sample_location;
	pipe.basePipelineHandle = VK_NULL_HANDLE;

	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100005), pipe, nullptr, 0))
		abort();
	sample_location.sampleLocationsEnable = VK_TRUE;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100006), pipe, nullptr, 0))
		abort();

	VkPipelineViewportDepthClipControlCreateInfoEXT clip_control = { VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT };
	clip_control.negativeOneToOne = VK_FALSE;
	vp.pNext = &clip_control;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100007), pipe, nullptr, 0))
		abort();
	clip_control.negativeOneToOne = VK_TRUE;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100008), pipe, nullptr, 0))
		abort();

	VkPipelineRobustnessCreateInfoEXT robustness_info = { VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT };
	robustness_info.vertexInputs = VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT;
	robustness_info.uniformBuffers = VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_EXT;
	robustness_info.storageBuffers = VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DISABLED_EXT;
	robustness_info.images = VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_ROBUST_IMAGE_ACCESS_2_EXT;
	pipe.pNext = &robustness_info;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100009), pipe, nullptr, 0))
		abort();
	robustness_info.images = VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_DISABLED_EXT;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100010), pipe, nullptr, 0))
		abort();

	VkDepthBiasRepresentationInfoEXT depth_bias_representation_info =
			{ VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT };
	depth_bias_representation_info.depthBiasRepresentation =
			VK_DEPTH_BIAS_REPRESENTATION_LEAST_REPRESENTABLE_VALUE_FORCE_UNORM_EXT;
	depth_bias_representation_info.depthBiasExact = VK_TRUE;
	rs.pNext = &depth_bias_representation_info;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100011), pipe, nullptr, 0))
		abort();

	VkPipelineViewportDepthClampControlCreateInfoEXT clamp_control = { VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT };
	vp.pNext = &clamp_control;
	clamp_control.depthClampMode = VK_DEPTH_CLAMP_MODE_VIEWPORT_RANGE_EXT;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100012), pipe, nullptr, 0))
		abort();
	clamp_control.depthClampMode = VK_DEPTH_CLAMP_MODE_USER_DEFINED_RANGE_EXT;
	VkDepthClampRangeEXT range = { 0.5f, 0.8f };
	clamp_control.pDepthClampRange = &range;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100013), pipe, nullptr, 0))
		abort();
	range = { 0.8f, 0.2f };
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100014), pipe, nullptr, 0))
		abort();

	VkRenderingAttachmentLocationInfoKHR attachment_location_info = { VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR };
	pipe.pNext = &attachment_location_info;
	attachment_location_info.colorAttachmentCount = 1;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100015), pipe, nullptr, 0))
		abort();
	attachment_location_info.colorAttachmentCount = 2;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100016), pipe, nullptr, 0))
		abort();

	const uint32_t color_locs[] = { 5, 4, UINT32_MAX };
	attachment_location_info.pColorAttachmentLocations = color_locs;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100017), pipe, nullptr, 0))
		abort();

	VkRenderingInputAttachmentIndexInfoKHR input_attachment_info = { VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR };
	input_attachment_info.colorAttachmentCount = 2;
	pipe.pNext = &input_attachment_info;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100018), pipe, nullptr, 0))
		abort();
	input_attachment_info.pColorAttachmentInputIndices = color_locs;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100019), pipe, nullptr, 0))
		abort();
	input_attachment_info.pDepthInputAttachmentIndex = color_locs + 1;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100020), pipe, nullptr, 0))
		abort();
	input_attachment_info.pStencilInputAttachmentIndex = color_locs + 2;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100021), pipe, nullptr, 0))
		abort();
}